

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::crate::CrateReader::BuildLiveFieldSets(CrateReader *this)

{
  uint uVar1;
  bool bVar2;
  difference_type dVar3;
  mapped_type *this_00;
  size_type sVar4;
  pointer pIVar5;
  value_type *this_01;
  string *psVar6;
  reference pvVar7;
  ValueRep *rep;
  ostream *poVar8;
  Index local_5b4;
  __normal_iterator<tinyusdz::crate::Index_*,_std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>_>
  local_5b0;
  __normal_iterator<tinyusdz::crate::Index_*,_std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>_>
  local_5a8;
  Index *local_5a0;
  Index *local_598;
  string local_590;
  ostringstream local_570 [8];
  ostringstream ss_e_2;
  string local_3f0;
  string local_3d0;
  ostringstream local_3b0 [8];
  ostringstream ss_e_1;
  undefined1 local_230 [8];
  optional<tinyusdz::Token> tokv;
  value_type *field;
  ostringstream local_1e0 [8];
  ostringstream ss_e;
  size_type local_68;
  size_t i;
  Index local_54;
  mapped_type *local_50;
  mapped_type *pairs;
  Index local_3c;
  __normal_iterator<tinyusdz::crate::Index_*,_std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>_>
  local_38;
  __normal_iterator<tinyusdz::crate::Index_*,_std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>_>
  local_30;
  __normal_iterator<tinyusdz::crate::Index_*,_std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>_>
  local_28;
  __normal_iterator<tinyusdz::crate::Index_*,_std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>_>
  fsEnd;
  iterator fsBegin;
  CrateReader *this_local;
  
  local_30._M_current =
       (Index *)::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::
                begin(&this->_fieldset_indices);
  fsEnd._M_current = local_30._M_current;
  local_38._M_current =
       (Index *)::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::end
                          (&this->_fieldset_indices);
  Index::Index(&local_3c);
  local_28 = ::std::
             find<__gnu_cxx::__normal_iterator<tinyusdz::crate::Index*,std::vector<tinyusdz::crate::Index,std::allocator<tinyusdz::crate::Index>>>,tinyusdz::crate::Index>
                       (local_30,local_38,&local_3c);
  do {
    pairs = (mapped_type *)
            ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::end
                      (&this->_fieldset_indices);
    bVar2 = __gnu_cxx::operator!=
                      (&fsEnd,(__normal_iterator<tinyusdz::crate::Index_*,_std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>_>
                               *)&pairs);
    if (!bVar2) {
      this_local._7_1_ = 1;
LAB_0023d9f8:
      return (bool)(this_local._7_1_ & 1);
    }
    i = (size_t)::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::
                begin(&this->_fieldset_indices);
    dVar3 = __gnu_cxx::operator-
                      (&fsEnd,(__normal_iterator<tinyusdz::crate::Index_*,_std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>_>
                               *)&i);
    Index::Index(&local_54,(uint32_t)dVar3);
    this_00 = ::std::
              map<tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>,_std::less<tinyusdz::crate::Index>,_std::allocator<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>_>
              ::operator[](&this->_live_fieldsets,&local_54);
    local_50 = this_00;
    sVar4 = __gnu_cxx::operator-(&local_28,&fsEnd);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
    ::resize(this_00,sVar4);
    local_68 = 0;
    while (bVar2 = __gnu_cxx::operator!=(&fsEnd,&local_28), bVar2) {
      pIVar5 = __gnu_cxx::
               __normal_iterator<tinyusdz::crate::Index_*,_std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>_>
               ::operator->(&fsEnd);
      uVar1 = pIVar5->value;
      sVar4 = ::std::vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>::size
                        (&this->_fields);
      if (sVar4 <= uVar1) {
        ::std::__cxx11::ostringstream::ostringstream(local_1e0);
        poVar8 = ::std::operator<<((ostream *)local_1e0,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"BuildLiveFieldSets");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x1715);
        ::std::operator<<(poVar8," ");
        poVar8 = ::std::operator<<((ostream *)local_1e0,"Invalid live field set data.");
        ::std::operator<<(poVar8,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&field);
        ::std::__cxx11::string::~string((string *)&field);
        ::std::__cxx11::ostringstream::~ostringstream(local_1e0);
        this_local._7_1_ = 0;
        goto LAB_0023d9f8;
      }
      pIVar5 = __gnu_cxx::
               __normal_iterator<tinyusdz::crate::Index_*,_std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>_>
               ::operator->(&fsEnd);
      tokv.contained._24_8_ =
           ::std::vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>::
           operator[](&this->_fields,(ulong)pIVar5->value);
      GetToken((optional<tinyusdz::Token> *)local_230,this,
               (Index)(((reference)tokv.contained._24_8_)->token_index).super_Index.value);
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_230);
      if (bVar2) {
        this_01 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                            ((optional<tinyusdz::Token> *)local_230);
        psVar6 = Token::str_abi_cxx11_(this_01);
        pvVar7 = ::std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
                 ::operator[](local_50,local_68);
        ::std::__cxx11::string::operator=((string *)pvVar7,(string *)psVar6);
        rep = (ValueRep *)(tokv.contained._24_8_ + 8);
        pvVar7 = ::std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
                 ::operator[](local_50,local_68);
        bVar2 = UnpackValueRep(this,rep,&pvVar7->second);
        if (bVar2) goto LAB_0023d92d;
        ::std::__cxx11::ostringstream::ostringstream(local_3b0);
        poVar8 = ::std::operator<<((ostream *)local_3b0,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"BuildLiveFieldSets");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x1720);
        ::std::operator<<(poVar8," ");
        poVar8 = ::std::operator<<((ostream *)local_3b0,
                                   "BuildLiveFieldSets: Failed to unpack ValueRep : ");
        ValueRep::GetStringRepr_abi_cxx11_(&local_3d0,(ValueRep *)(tokv.contained._24_8_ + 8));
        poVar8 = ::std::operator<<(poVar8,(string *)&local_3d0);
        ::std::operator<<(poVar8,"\n");
        ::std::__cxx11::string::~string((string *)&local_3d0);
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_3f0);
        ::std::__cxx11::string::~string((string *)&local_3f0);
        ::std::__cxx11::ostringstream::~ostringstream(local_3b0);
        this_local._7_1_ = 0;
        bVar2 = true;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_570);
        poVar8 = ::std::operator<<((ostream *)local_570,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"BuildLiveFieldSets");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x1724);
        ::std::operator<<(poVar8," ");
        poVar8 = ::std::operator<<((ostream *)local_570,"Invalid token index.");
        ::std::operator<<(poVar8,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_590);
        ::std::__cxx11::string::~string((string *)&local_590);
        ::std::__cxx11::ostringstream::~ostringstream(local_570);
LAB_0023d92d:
        bVar2 = false;
      }
      nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                ((optional<tinyusdz::Token> *)local_230);
      if (bVar2) goto LAB_0023d9f8;
      __gnu_cxx::
      __normal_iterator<tinyusdz::crate::Index_*,_std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>_>
      ::operator++(&fsEnd);
      local_68 = local_68 + 1;
    }
    local_5a8 = __gnu_cxx::
                __normal_iterator<tinyusdz::crate::Index_*,_std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>_>
                ::operator+(&local_28,1);
    local_598 = (Index *)local_5a8;
    fsEnd._M_current = (Index *)local_5a8;
    local_5b0._M_current =
         (Index *)::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::
                  end(&this->_fieldset_indices);
    Index::Index(&local_5b4);
    local_5a0 = (Index *)::std::
                         find<__gnu_cxx::__normal_iterator<tinyusdz::crate::Index*,std::vector<tinyusdz::crate::Index,std::allocator<tinyusdz::crate::Index>>>,tinyusdz::crate::Index>
                                   (local_5a8,local_5b0,&local_5b4);
    local_28 = (__normal_iterator<tinyusdz::crate::Index_*,_std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>_>
                )local_5a0;
  } while( true );
}

Assistant:

bool CrateReader::BuildLiveFieldSets() {
  for (auto fsBegin = _fieldset_indices.begin(),
            fsEnd = std::find(fsBegin, _fieldset_indices.end(), crate::Index());
       fsBegin != _fieldset_indices.end();
       fsBegin = fsEnd + 1, fsEnd = std::find(fsBegin, _fieldset_indices.end(),
                                              crate::Index())) {
    auto &pairs = _live_fieldsets[crate::Index(
        uint32_t(fsBegin - _fieldset_indices.begin()))];

    pairs.resize(size_t(fsEnd - fsBegin));
    DCOUT("range size = " << (fsEnd - fsBegin));
    // TODO(syoyo): Parallelize.
    for (size_t i = 0; fsBegin != fsEnd; ++fsBegin, ++i) {
      if (fsBegin->value < _fields.size()) {
        // ok
      } else {
        PUSH_ERROR("Invalid live field set data.");
        return false;
      }

      DCOUT("fieldIndex = " << (fsBegin->value));
      auto const &field = _fields[fsBegin->value];
      if (auto tokv = GetToken(field.token_index)) {
        pairs[i].first = tokv.value().str();

        if (!UnpackValueRep(field.value_rep, &pairs[i].second)) {
          PUSH_ERROR("BuildLiveFieldSets: Failed to unpack ValueRep : "
                     << field.value_rep.GetStringRepr());
          return false;
        }
      } else {
        PUSH_ERROR("Invalid token index.");
      }
    }
  }

  DCOUT("# of live fieldsets = " << _live_fieldsets.size());

#ifdef TINYUSDZ_LOCAL_DEBUG_PRINT
  size_t sum = 0;
  for (const auto &item : _live_fieldsets) {
    DCOUT("livefieldsets[" << item.first.value
                           << "].count = " << item.second.size());
    sum += item.second.size();

    for (size_t i = 0; i < item.second.size(); i++) {
      DCOUT(" [" << i << "] name = " << item.second[i].first);
    }
  }
  DCOUT("Total fields used = " << sum);
#endif

  return true;
}